

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void cleanup_test_files(void)

{
  undefined1 local_1c8 [8];
  uv_fs_t req;
  
  uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir/file1",(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir/file2",(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir/test_subdir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir",(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  return;
}

Assistant:

static void cleanup_test_files(void) {
  uv_fs_t req;

  uv_fs_unlink(NULL, &req, "test_dir/file1", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_unlink(NULL, &req, "test_dir/file2", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_rmdir(NULL, &req, "test_dir/test_subdir", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_rmdir(NULL, &req, "test_dir", NULL);
  uv_fs_req_cleanup(&req);
}